

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O3

void __thiscall t_cpp_generator::~t_cpp_generator(t_cpp_generator *this)

{
  pointer pcVar1;
  
  (this->super_t_oop_generator).super_t_generator._vptr_t_generator =
       (_func_int **)&PTR__t_cpp_generator_0040f478;
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  ~template_ofstream_with_content_based_conditional_update
            (&this->f_service_tcc_,
             &template_ofstream_with_content_based_conditional_update<char,std::char_traits<char>>::
              VTT);
  std::ios_base::~ios_base
            ((ios_base *)
             &(this->f_service_tcc_).super_ostringstream.
              super_basic_ostream<char,_std::char_traits<char>_>.field_0x98);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  ~template_ofstream_with_content_based_conditional_update
            (&this->f_service_,
             &template_ofstream_with_content_based_conditional_update<char,std::char_traits<char>>::
              VTT);
  std::ios_base::~ios_base
            ((ios_base *)
             &(this->f_service_).super_ostringstream.
              super_basic_ostream<char,_std::char_traits<char>_>.field_0x98);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  ~template_ofstream_with_content_based_conditional_update
            (&this->f_header_,
             &template_ofstream_with_content_based_conditional_update<char,std::char_traits<char>>::
              VTT);
  std::ios_base::~ios_base
            ((ios_base *)
             &(this->f_header_).super_ostringstream.
              super_basic_ostream<char,_std::char_traits<char>_>.field_0x98);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  ~template_ofstream_with_content_based_conditional_update
            (&this->f_types_tcc_,
             &template_ofstream_with_content_based_conditional_update<char,std::char_traits<char>>::
              VTT);
  std::ios_base::~ios_base
            ((ios_base *)
             &(this->f_types_tcc_).super_ostringstream.
              super_basic_ostream<char,_std::char_traits<char>_>.field_0x98);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  ~template_ofstream_with_content_based_conditional_update
            (&this->f_types_impl_,
             &template_ofstream_with_content_based_conditional_update<char,std::char_traits<char>>::
              VTT);
  std::ios_base::~ios_base
            ((ios_base *)
             &(this->f_types_impl_).super_ostringstream.
              super_basic_ostream<char,_std::char_traits<char>_>.field_0x98);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  ~template_ofstream_with_content_based_conditional_update
            (&this->f_types_,
             &template_ofstream_with_content_based_conditional_update<char,std::char_traits<char>>::
              VTT);
  std::ios_base::~ios_base
            ((ios_base *)
             &(this->f_types_).super_ostringstream.
              super_basic_ostream<char,_std::char_traits<char>_>.field_0x98);
  pcVar1 = (this->ns_close_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->ns_close_).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->ns_open_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->ns_open_).field_2) {
    operator_delete(pcVar1);
  }
  t_generator::~t_generator((t_generator *)this);
  return;
}

Assistant:

t_cpp_generator(t_program* program,
                  const std::map<std::string, std::string>& parsed_options,
                  const std::string& option_string)
    : t_oop_generator(program) {
    (void)option_string;
    std::map<std::string, std::string>::const_iterator iter;


    gen_pure_enums_ = false;
    use_include_prefix_ = false;
    gen_cob_style_ = false;
    gen_no_client_completion_ = false;
    gen_no_default_operators_ = false;
    gen_templates_ = false;
    gen_templates_only_ = false;
    gen_moveable_ = false;
    gen_no_ostream_operators_ = false;
    gen_no_skeleton_ = false;
    has_members_ = false;

    for( iter = parsed_options.begin(); iter != parsed_options.end(); ++iter) {
      if( iter->first.compare("pure_enums") == 0) {
        gen_pure_enums_ = true;
      } else if( iter->first.compare("include_prefix") == 0) {
        use_include_prefix_ = true;
      } else if( iter->first.compare("cob_style") == 0) {
        gen_cob_style_ = true;
      } else if( iter->first.compare("no_client_completion") == 0) {
        gen_no_client_completion_ = true;
      } else if( iter->first.compare("no_default_operators") == 0) {
        gen_no_default_operators_ = true;
      } else if( iter->first.compare("templates") == 0) {
        gen_templates_ = true;
        gen_templates_only_ = (iter->second == "only");
      } else if( iter->first.compare("moveable_types") == 0) {
        gen_moveable_ = true;
      } else if ( iter->first.compare("no_ostream_operators") == 0) {
        gen_no_ostream_operators_ = true;
      } else if ( iter->first.compare("no_skeleton") == 0) {
        gen_no_skeleton_ = true;
      } else {
        throw "unknown option cpp:" + iter->first;
      }
    }

    out_dir_base_ = "gen-cpp";
  }